

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_dio.cc
# Opt level: O3

bool __thiscall
sptk::PitchExtractionByDio::Get
          (PitchExtractionByDio *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  double *x;
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> tmp_f0;
  vector<double,_std::allocator<double>_> time_axis;
  allocator_type local_99;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  DioOption local_68;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar10 = true;
    if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
      world::InitializeDioOption(&local_68);
      local_68.frame_period = ((double)this->frame_shift_ * 1000.0) / this->sampling_rate_;
      local_68.f0_floor = this->lower_f0_;
      local_68.f0_ceil = this->upper_f0_;
      local_68.allowed_range = this->voicing_threshold_;
      iVar4 = world::GetSamplesForDIO
                        ((int)this->sampling_rate_,
                         (int)((ulong)((long)(waveform->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(waveform->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_start) >> 3),
                         local_68.frame_period);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_80,(long)iVar4,(allocator_type *)&local_98);
      std::vector<double,_std::allocator<double>_>::vector(&local_98,(long)iVar4,&local_99);
      x = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
      world::Dio(x,(int)((ulong)((long)(waveform->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)x) >> 3),
                 (int)this->sampling_rate_,&local_68,
                 local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      lVar6 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar7 = lVar6 >> 3;
      auVar12._8_4_ = (int)(lVar6 >> 0x23);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      dVar11 = ceil(((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                    (double)this->frame_shift_);
      iVar5 = (int)dVar11;
      if (iVar5 < iVar4) {
        std::vector<double,_std::allocator<double>_>::resize(&local_98,(long)iVar5);
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar5);
      if ((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        memmove((f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,
                local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      }
      auVar3 = _DAT_0012bcc0;
      auVar12 = _DAT_0012bcb0;
      pdVar1 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pointer)((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                   ((long)pdVar1 -
                   (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start)) != pdVar2) {
        dVar11 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
        uVar8 = (((long)pdVar2 +
                 (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) -
                ((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + (long)pdVar1)) - 8;
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar13._0_8_ = uVar8 >> 3;
        auVar13._8_8_ = auVar15._8_8_ >> 3;
        uVar9 = 0;
        auVar13 = auVar13 ^ _DAT_0012bcc0;
        do {
          auVar14._8_4_ = (int)uVar9;
          auVar14._0_8_ = uVar9;
          auVar14._12_4_ = (int)(uVar9 >> 0x20);
          auVar15 = (auVar14 | auVar12) ^ auVar3;
          if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                      auVar13._4_4_ < auVar15._4_4_) & 1)) {
            *(double *)
             ((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish +
             (long)pdVar1 +
             (uVar9 * 8 -
             (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start)) = dVar11;
          }
          if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
              auVar15._12_4_ <= auVar13._12_4_) {
            *(double *)
             ((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish +
             (long)pdVar1 +
             uVar9 * 8 +
             (8 - (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start)) = dVar11;
          }
          uVar9 = uVar9 + 2;
        } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
      }
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool PitchExtractionByDio::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    world::DioOption option;
    world::InitializeDioOption(&option);

    const double frame_period((1000.0 * frame_shift_) / sampling_rate_);
    option.frame_period = frame_period;
    option.f0_floor = lower_f0_;
    option.f0_ceil = upper_f0_;
    option.allowed_range = voicing_threshold_;

    const int tmp_length(world::GetSamplesForDIO(
        static_cast<int>(sampling_rate_), static_cast<int>(waveform.size()),
        frame_period));
    std::vector<double> time_axis(tmp_length);
    std::vector<double> tmp_f0(tmp_length);
    world::Dio(waveform.data(), static_cast<int>(waveform.size()),
               static_cast<int>(sampling_rate_), &option, time_axis.data(),
               tmp_f0.data());

    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}